

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall
chaiscript::eval::Fun_Call_AST_Node::Fun_Call_AST_Node
          (Fun_Call_AST_Node *this,string *t_ast_node_text,Parse_Location *t_loc,
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          *t_children)

{
  Parse_Location *in_RDX;
  string *in_RSI;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *in_RDI;
  Parse_Location *in_stack_ffffffffffffff68;
  Parse_Location *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  AST_Node *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RSI);
  Parse_Location::Parse_Location(in_RDX,in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)in_RDX,
           (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)in_stack_ffffffffffffff68);
  AST_Node::AST_Node(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                     in_stack_ffffffffffffff88,in_RDI);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(in_RDI);
  Parse_Location::~Parse_Location((Parse_Location *)0x24ffb5);
  std::__cxx11::string::~string(local_40);
  (in_RDI->
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_pretty_print_abi_cxx11__005c09c0;
  return;
}

Assistant:

Fun_Call_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, std::vector<AST_NodePtr> t_children) :
          AST_Node(std::move(t_ast_node_text), AST_Node_Type::Fun_Call, std::move(t_loc), std::move(t_children)) { }